

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# struct_concat.cpp
# Opt level: O0

void duckdb::StructConcatFunction(DataChunk *args,ExpressionState *state,Vector *result)

{
  bool bVar1;
  iterator other;
  Vector *in_RDI;
  unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true> *child_col;
  const_iterator __end2;
  const_iterator __begin2;
  vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_true>
  *__range2;
  vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_true>
  *child_cols;
  Vector *arg;
  iterator __end1;
  iterator __begin1;
  vector<duckdb::Vector,_true> *__range1;
  idx_t offset;
  vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_true>
  *result_cols;
  Vector *in_stack_ffffffffffffff78;
  vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_true>
  *in_stack_ffffffffffffff80;
  pointer in_stack_ffffffffffffff88;
  Vector *in_stack_ffffffffffffff90;
  const_iterator in_stack_ffffffffffffff98;
  __normal_iterator<const_duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_*,_std::vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>_>
  local_60;
  Vector *in_stack_ffffffffffffffa8;
  VectorType vector_type_p;
  Vector *in_stack_ffffffffffffffb0;
  Vector *this;
  
  StructVector::GetEntries(in_stack_ffffffffffffff78);
  bVar1 = DataChunk::AllConstant((DataChunk *)in_stack_ffffffffffffff98._M_current);
  if (!bVar1) {
    DataChunk::Flatten((DataChunk *)in_stack_ffffffffffffff90);
  }
  this = in_RDI;
  other = ::std::vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>::begin
                    (in_stack_ffffffffffffff78);
  ::std::vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>::end
            ((vector<duckdb::Vector,_std::allocator<duckdb::Vector>_> *)in_stack_ffffffffffffff78);
  while( true ) {
    vector_type_p = (VectorType)((ulong)in_stack_ffffffffffffffa8 >> 0x38);
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<duckdb::Vector_*,_std::vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>_>
                        *)in_stack_ffffffffffffff80,
                       (__normal_iterator<duckdb::Vector_*,_std::vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>_>
                        *)in_stack_ffffffffffffff78);
    if (!bVar1) break;
    __gnu_cxx::
    __normal_iterator<duckdb::Vector_*,_std::vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>_>
    ::operator*((__normal_iterator<duckdb::Vector_*,_std::vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>_>
                 *)&stack0xffffffffffffffc8);
    in_stack_ffffffffffffffa8 = (Vector *)StructVector::GetEntries(in_stack_ffffffffffffff78);
    in_stack_ffffffffffffffb0 = in_stack_ffffffffffffffa8;
    local_60._M_current =
         (unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true> *)
         ::std::
         vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
         ::begin((vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
                  *)in_stack_ffffffffffffff78);
    in_stack_ffffffffffffff98 =
         ::std::
         vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
         ::end((vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
                *)in_stack_ffffffffffffff78);
    while (bVar1 = __gnu_cxx::operator!=
                             ((__normal_iterator<const_duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_*,_std::vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>_>
                               *)in_stack_ffffffffffffff80,
                              (__normal_iterator<const_duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_*,_std::vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>_>
                               *)in_stack_ffffffffffffff78), bVar1) {
      in_stack_ffffffffffffff90 =
           (Vector *)
           __gnu_cxx::
           __normal_iterator<const_duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_*,_std::vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>_>
           ::operator*(&local_60);
      vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_true>::
      operator[](in_stack_ffffffffffffff80,(size_type)in_stack_ffffffffffffff78);
      in_stack_ffffffffffffff88 =
           unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>::operator->
                     ((unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true> *)
                      in_stack_ffffffffffffff80);
      unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>::operator*
                ((unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true> *)
                 in_stack_ffffffffffffff80);
      Vector::Reference(this,other._M_current);
      __gnu_cxx::
      __normal_iterator<const_duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_*,_std::vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>_>
      ::operator++(&local_60);
    }
    __gnu_cxx::
    __normal_iterator<duckdb::Vector_*,_std::vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>_>
    ::operator++((__normal_iterator<duckdb::Vector_*,_std::vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>_>
                  *)&stack0xffffffffffffffc8);
  }
  bVar1 = DataChunk::AllConstant((DataChunk *)in_stack_ffffffffffffff98._M_current);
  if (bVar1) {
    Vector::SetVectorType(in_stack_ffffffffffffffb0,vector_type_p);
  }
  DataChunk::size((DataChunk *)in_RDI);
  Vector::Verify(in_stack_ffffffffffffff90,(idx_t)in_stack_ffffffffffffff88);
  return;
}

Assistant:

static void StructConcatFunction(DataChunk &args, ExpressionState &state, Vector &result) {
	auto &result_cols = StructVector::GetEntries(result);
	idx_t offset = 0;

	if (!args.AllConstant()) {
		// Unless all arguments are constant, we flatten the input to make sure it's homogeneous
		args.Flatten();
	}

	for (auto &arg : args.data) {
		const auto &child_cols = StructVector::GetEntries(arg);
		for (auto &child_col : child_cols) {
			result_cols[offset++]->Reference(*child_col);
		}
	}
	D_ASSERT(offset == result_cols.size());

	if (args.AllConstant()) {
		result.SetVectorType(VectorType::CONSTANT_VECTOR);
	}

	result.Verify(args.size());
}